

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalHashJoin::ExecuteInternal
          (PhysicalHashJoin *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state_p)

{
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *this_00;
  ScanStructure *scan_structure;
  JoinType join_type;
  bool bVar1;
  HashJoinGlobalSinkState *this_01;
  pointer pJVar2;
  pointer this_02;
  idx_t *piVar3;
  pointer this_03;
  type state_p_00;
  pointer this_04;
  type probe_spill;
  byte bVar4;
  DataChunk *pDVar5;
  ProbeSpillLocalState PVar6;
  
  this_01 = (HashJoinGlobalSinkState *)
            unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                          super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  this_00 = &this_01->hash_table;
  pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(this_00);
  this_02 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(&pJVar2->data_collection);
  piVar3 = TupleDataCollection::Count(this_02);
  if (*piVar3 == 0) {
    bVar4 = (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
            field_0x81 - 2;
    if ((bVar4 < 9) && ((0x18bU >> (bVar4 & 0x1f) & 1) != 0)) {
      return FINISHED;
    }
    DataChunk::ReferenceColumns
              ((DataChunk *)(state_p + 0x41),input,&(this->lhs_output_columns).col_idxs);
    pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->(this_00);
    join_type = pJVar2->join_type;
    pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->(this_00);
    PhysicalComparisonJoin::ConstructEmptyJoinResult
              (join_type,pJVar2->has_null,(DataChunk *)(state_p + 0x41),chunk);
  }
  else if ((this_01->perfect_join_executor).
           super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl ==
           (PerfectHashJoinExecutor *)0x0) {
    if ((this_01->external == true) && (*(char *)&state_p[2]._vptr_OperatorState == '\0')) {
      if ((this_01->probe_spill).
          super_unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
          .super__Head_base<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_false>._M_head_impl ==
          (ProbeSpill *)0x0) {
        HashJoinGlobalSinkState::InitializeProbeSpill(this_01);
      }
      this_04 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
                ::operator->(&this_01->probe_spill);
      PVar6 = JoinHashTable::ProbeSpill::RegisterThread(this_04);
      *(ProbeSpillLocalState *)(state_p + 0x82) = PVar6;
      *(undefined1 *)&state_p[2]._vptr_OperatorState = 1;
    }
    scan_structure = (ScanStructure *)(state_p + 0x52);
    if (*(char *)((long)&state_p[0x6c]._vptr_OperatorState + 1) == '\x01') {
      pDVar5 = (DataChunk *)(state_p + 3);
      DataChunk::Reset(pDVar5);
      ExpressionExecutor::Execute((ExpressionExecutor *)(state_p + 0x49),input,pDVar5);
      bVar1 = this_01->external;
      pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
               operator->(this_00);
      if (bVar1 == true) {
        probe_spill = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
                      ::operator*(&this_01->probe_spill);
        JoinHashTable::ProbeAndSpill
                  (pJVar2,scan_structure,pDVar5,(TupleDataChunkState *)(state_p + 0xb),
                   (ProbeState *)(state_p + 0x84),input,probe_spill,
                   (ProbeSpillLocalAppendState *)(state_p + 0x82),(DataChunk *)(state_p + 0xc1));
      }
      else {
        JoinHashTable::Probe
                  (pJVar2,scan_structure,pDVar5,(TupleDataChunkState *)(state_p + 0xb),
                   (ProbeState *)(state_p + 0x84),(optional_ptr<duckdb::Vector,_true>)0x0);
      }
    }
    DataChunk::ReferenceColumns
              ((DataChunk *)(state_p + 0x41),input,&(this->lhs_output_columns).col_idxs);
    JoinHashTable::ScanStructure::Next
              (scan_structure,(DataChunk *)(state_p + 3),(DataChunk *)(state_p + 0x41),chunk);
    bVar1 = JoinHashTable::ScanStructure::PointersExhausted(scan_structure);
    if (!bVar1) {
      return HAVE_MORE_OUTPUT;
    }
    if (chunk->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
    *(undefined1 *)((long)&state_p[0x6c]._vptr_OperatorState + 1) = 1;
  }
  else {
    pDVar5 = input;
    DataChunk::ReferenceColumns
              ((DataChunk *)(state_p + 0x41),input,&(this->lhs_output_columns).col_idxs);
    this_03 = unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
              ::operator->(&this_01->perfect_join_executor);
    state_p_00 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                 ::operator*((unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                              *)(state_p + 0x81));
    PerfectHashJoinExecutor::ProbePerfectHashTable
              (this_03,(ExecutionContext *)pDVar5,input,(DataChunk *)(state_p + 0x41),chunk,
               state_p_00);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalHashJoin::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                     GlobalOperatorState &gstate, OperatorState &state_p) const {
	auto &state = state_p.Cast<HashJoinOperatorState>();
	auto &sink = sink_state->Cast<HashJoinGlobalSinkState>();
	D_ASSERT(sink.finalized);
	D_ASSERT(!sink.scanned_data);

	if (sink.hash_table->Count() == 0) {
		if (EmptyResultIfRHSIsEmpty()) {
			return OperatorResultType::FINISHED;
		}
		state.lhs_output.ReferenceColumns(input, lhs_output_columns.col_idxs);
		ConstructEmptyJoinResult(sink.hash_table->join_type, sink.hash_table->has_null, state.lhs_output, chunk);
		return OperatorResultType::NEED_MORE_INPUT;
	}

	if (sink.perfect_join_executor) {
		D_ASSERT(!sink.external);
		state.lhs_output.ReferenceColumns(input, lhs_output_columns.col_idxs);
		return sink.perfect_join_executor->ProbePerfectHashTable(context, input, state.lhs_output, chunk,
		                                                         *state.perfect_hash_join_state);
	}

	if (sink.external && !state.initialized) {
		// some initialization for external hash join
		if (!sink.probe_spill) {
			sink.InitializeProbeSpill();
		}
		state.spill_state = sink.probe_spill->RegisterThread();
		state.initialized = true;
	}

	if (state.scan_structure.is_null) {
		// probe the HT, start by resolving the join keys for the left chunk
		state.lhs_join_keys.Reset();
		state.probe_executor.Execute(input, state.lhs_join_keys);

		// perform the actual probe
		if (sink.external) {
			sink.hash_table->ProbeAndSpill(state.scan_structure, state.lhs_join_keys, state.join_key_state,
			                               state.probe_state, input, *sink.probe_spill, state.spill_state,
			                               state.spill_chunk);
		} else {
			sink.hash_table->Probe(state.scan_structure, state.lhs_join_keys, state.join_key_state, state.probe_state);
		}
	}

	state.lhs_output.ReferenceColumns(input, lhs_output_columns.col_idxs);
	state.scan_structure.Next(state.lhs_join_keys, state.lhs_output, chunk);

	if (state.scan_structure.PointersExhausted() && chunk.size() == 0) {
		state.scan_structure.is_null = true;
		return OperatorResultType::NEED_MORE_INPUT;
	}
	return OperatorResultType::HAVE_MORE_OUTPUT;
}